

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int ssl_calc_verify_tls_legacy
              (mbedtls_ssl_context *ssl,mbedtls_md_context_t *hs_ctx,uchar *hash,size_t *hlen)

{
  byte bVar1;
  mbedtls_md_info_t *pmVar2;
  undefined1 local_48 [8];
  mbedtls_md_context_t cloned_ctx;
  int ret;
  size_t *hlen_local;
  uchar *hash_local;
  mbedtls_md_context_t *hs_ctx_local;
  mbedtls_ssl_context *ssl_local;
  
  cloned_ctx.hmac_ctx._4_4_ = 0xffffff92;
  mbedtls_md_init((mbedtls_md_context_t *)local_48);
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
             ,0x19fd,"=> calc verify");
  pmVar2 = mbedtls_md_info_from_ctx(hs_ctx);
  cloned_ctx.hmac_ctx._4_4_ = mbedtls_md_setup((mbedtls_md_context_t *)local_48,pmVar2,0);
  if (((cloned_ctx.hmac_ctx._4_4_ == 0) &&
      (cloned_ctx.hmac_ctx._4_4_ = mbedtls_md_clone((mbedtls_md_context_t *)local_48,hs_ctx),
      cloned_ctx.hmac_ctx._4_4_ == 0)) &&
     (cloned_ctx.hmac_ctx._4_4_ = mbedtls_md_finish((mbedtls_md_context_t *)local_48,hash),
     cloned_ctx.hmac_ctx._4_4_ == 0)) {
    pmVar2 = mbedtls_md_info_from_ctx(hs_ctx);
    bVar1 = mbedtls_md_get_size(pmVar2);
    *hlen = (ulong)bVar1;
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,0x1a0f,"calculated verify result",hash,*hlen);
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,0x1a10,"<= calc verify");
  }
  mbedtls_md_free((mbedtls_md_context_t *)local_48);
  return cloned_ctx.hmac_ctx._4_4_;
}

Assistant:

static int ssl_calc_verify_tls_legacy(const mbedtls_ssl_context *ssl,
                                      const mbedtls_md_context_t *hs_ctx,
                                      unsigned char *hash,
                                      size_t *hlen)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_md_context_t cloned_ctx;

    mbedtls_md_init(&cloned_ctx);

#if !defined(MBEDTLS_DEBUG_C)
    (void) ssl;
#endif
    MBEDTLS_SSL_DEBUG_MSG(2, ("=> calc verify"));

    ret = mbedtls_md_setup(&cloned_ctx, mbedtls_md_info_from_ctx(hs_ctx), 0);
    if (ret != 0) {
        goto exit;
    }
    ret = mbedtls_md_clone(&cloned_ctx, hs_ctx);
    if (ret != 0) {
        goto exit;
    }

    ret = mbedtls_md_finish(&cloned_ctx, hash);
    if (ret != 0) {
        goto exit;
    }

    *hlen = mbedtls_md_get_size(mbedtls_md_info_from_ctx(hs_ctx));

    MBEDTLS_SSL_DEBUG_BUF(3, "calculated verify result", hash, *hlen);
    MBEDTLS_SSL_DEBUG_MSG(2, ("<= calc verify"));

exit:
    mbedtls_md_free(&cloned_ctx);
    return ret;
}